

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_manager.cpp
# Opt level: O2

void __thiscall cff::ColorManager::SetFgColor(ColorManager *this,Color col)

{
  if (col < (WHITE_DARK|BLACK)) {
    std::operator<<((ostream *)&std::cout,&DAT_001075e8 + *(int *)(&DAT_001075e8 + (ulong)col * 4));
    return;
  }
  return;
}

Assistant:

void ColorManager::SetFgColor(Color col) {
        if(col == RESET) {
            std::cout << "\033[0m";
        } else if(col == BLACK) {
            std::cout << "\x1B[90m";
        } else if(col == RED) {
            std::cout << "\x1B[91m";
        } else if(col == GREEN) {
            std::cout << "\x1B[92m";
        } else if(col == YELLOW) {
            std::cout << "\x1B[93m";
        } else if(col == BLUE) {
            std::cout << "\x1B[94m";
        } else if(col == MAGENTA) {
            std::cout << "\x1B[95m";
        } else if(col == CYAN) {
            std::cout << "\x1B[96m";
        } else if(col == WHITE) {
            std::cout << "\x1B[97m";
        } else if(col == BLACK_DARK) {
            std::cout << "\x1B[30m";
        } else if(col == RED_DARK) {
            std::cout << "\x1B[31m";
        } else if(col == GREEN_DARK) {
            std::cout << "\x1B[32m";
        } else if(col == YELLOW_DARK) {
            std::cout << "\x1B[33m";
        } else if(col == BLUE_DARK) {
            std::cout << "\x1B[34m";
        } else if(col == MAGENTA_DARK) {
            std::cout << "\x1B[35m";
        } else if(col == CYAN_DARK) {
            std::cout << "\x1B[36m";
        } else if(col == WHITE_DARK) {
            std::cout << "\x1B[37m";
        }
    }